

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolSetScalingVectors(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int ier;
  undefined4 local_1c;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x20) == 0) {
    local_1c = 0;
  }
  else {
    local_1c = (**(code **)(*(long *)(in_RDI + 8) + 0x20))(in_RDI,in_RSI,in_RDX);
  }
  return local_1c;
}

Assistant:

int SUNLinSolSetScalingVectors(SUNLinearSolver S,
                               N_Vector s1, N_Vector s2)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setscalingvectors)
    ier = S->ops->setscalingvectors(S, s1, s2);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}